

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

_Bool upb_MiniTable_SetSubEnum
                (upb_MiniTable *table,upb_MiniTableField *field,upb_MiniTableEnum *sub)

{
  if ((table->fields_dont_copy_me__upb_internal_use_only <= field) &&
     (field < table->fields_dont_copy_me__upb_internal_use_only +
              table->field_count_dont_copy_me__upb_internal_use_only)) {
    if (sub != (upb_MiniTableEnum *)0x0) {
      table->subs_dont_copy_me__upb_internal_use_only
      [field->submsg_index_dont_copy_me__upb_internal_use_only].
      subenum_dont_copy_me__upb_internal_use_only = sub;
      return true;
    }
    __assert_fail("sub",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_descriptor/link.c"
                  ,0x47,
                  "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
                 );
  }
  __assert_fail("(uintptr_t)table->fields_dont_copy_me__upb_internal_use_only <= (uintptr_t)field && (uintptr_t)field < (uintptr_t)(table->fields_dont_copy_me__upb_internal_use_only + table->field_count_dont_copy_me__upb_internal_use_only)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_descriptor/link.c"
                ,0x46,
                "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
               );
}

Assistant:

bool upb_MiniTable_SetSubEnum(upb_MiniTable* table, upb_MiniTableField* field,
                              const upb_MiniTableEnum* sub) {
  UPB_ASSERT((uintptr_t)table->UPB_PRIVATE(fields) <= (uintptr_t)field &&
             (uintptr_t)field < (uintptr_t)(table->UPB_PRIVATE(fields) +
                                            table->UPB_PRIVATE(field_count)));
  UPB_ASSERT(sub);

  upb_MiniTableSub* table_sub =
      (void*)&table->UPB_PRIVATE(subs)[field->UPB_PRIVATE(submsg_index)];
  *table_sub = upb_MiniTableSub_FromEnum(sub);
  return true;
}